

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O1

int sqlite3Fts5IndexQuery
              (Fts5Index *p,char *pToken,int nToken,int flags,Fts5Colset *pColset,
              Fts5IndexIter **ppIter)

{
  int *pRc;
  sqlite3_stmt **ppStmt;
  Fts5Buffer *pRight;
  u8 **ppuVar1;
  byte *pbVar2;
  ushort uVar3;
  Fts5Config *pFVar4;
  Vdbe *p_00;
  sqlite3_mutex *psVar5;
  Fts5TombstoneArray *pFVar6;
  Fts5Data *pFVar7;
  Fts5Index *pFVar8;
  sqlite3_blob *pBlob;
  bool bVar9;
  u8 *pToken_00;
  undefined1 zData [8];
  void *pvVar10;
  byte bVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  uint uVar15;
  Fts5Structure *pFVar16;
  Fts5Iter *pFVar17;
  char *zSql;
  Mem *pMem;
  code *pcVar18;
  Fts5TokenDataIter *__s;
  undefined8 *p_01;
  int iVar19;
  u8 *puVar20;
  long lVar21;
  long lVar22;
  u32 nByte;
  u32 uVar23;
  ulong uVar24;
  Fts5SegIter *__src;
  Fts5TokenDataIter *pSet;
  long lVar25;
  Fts5Buffer *pLeft;
  Fts5SegIter *pIter;
  ulong uVar26;
  u64 nBytes;
  Fts5StructureSegment *pSeg;
  Vdbe *p_1;
  size_t __n;
  Fts5Data **ppFVar27;
  long in_FS_OFFSET;
  Fts5Buffer buf;
  Fts5Iter *pRet;
  Fts5Iter *local_108;
  Fts5Buffer local_b8;
  Fts5Iter *local_a0;
  Fts5TokenDataIter *local_98;
  undefined8 uStack_90;
  undefined1 local_88 [8];
  undefined8 uStack_80;
  undefined8 local_78;
  ulong uStack_70;
  void *local_68;
  undefined8 uStack_60;
  void *local_58;
  undefined8 uStack_50;
  Fts5TokenDataIter **local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  pFVar4 = p->pConfig;
  local_a0 = (Fts5Iter *)0x0;
  local_b8.p = (u8 *)0x0;
  local_b8.n = 0;
  local_b8.nSpace = 0;
  pRc = &p->rc;
  __n = (long)nToken + 1;
  nByte = (u32)__n;
  iVar12 = sqlite3Fts5BufferSize(pRc,&local_b8,nByte);
  if (iVar12 == 0) {
    iVar12 = pFVar4->bTokendata;
    if (0 < nToken) {
      memcpy(local_b8.p + 1,pToken,(ulong)(uint)nToken);
    }
    pToken_00 = local_b8.p;
    uVar24 = 0;
    iVar14 = 0;
    if ((flags & 1U) != 0) {
      iVar14 = 0;
      iVar13 = 0;
      if (0 < nToken) {
        iVar19 = 0;
        iVar13 = 0;
        do {
          iVar19 = iVar19 + 1;
          iVar13 = iVar13 + 1;
        } while (iVar19 < nToken);
      }
      if (pFVar4->nPrefix < 1) {
        uVar24 = 1;
      }
      else {
        uVar24 = (ulong)(uint)pFVar4->nPrefix + 1;
        uVar26 = 1;
        iVar19 = 0;
        do {
          iVar14 = (int)uVar26;
          if (pFVar4->aPrefix[uVar26 - 1] != iVar13 + 1) {
            iVar14 = iVar19;
          }
          if (pFVar4->aPrefix[uVar26 - 1] == iVar13) {
            uVar24 = uVar26 & 0xffffffff;
            iVar14 = iVar19;
            break;
          }
          uVar26 = uVar26 + 1;
          iVar19 = iVar14;
        } while (uVar24 != uVar26);
      }
    }
    if ((((flags & 0x88U) == 0) && (iVar12 != 0)) && ((int)uVar24 == 0)) {
      *local_b8.p = '0';
      local_88 = (undefined1  [8])0x0;
      uStack_80 = (code *)0x0;
      fts5IndexFlush(p);
      pFVar16 = fts5StructureRead(p);
      ppStmt = &p->pIdxNextSelect;
      pLeft = (Fts5Buffer *)0x0;
      pSet = (Fts5TokenDataIter *)0x0;
      do {
        if (*pRc != 0) break;
        if (pSet == (Fts5TokenDataIter *)0x0) {
          local_108 = (Fts5Iter *)0x0;
        }
        else {
          local_108 = pSet->apIter[(long)pSet->nIter + -1];
        }
        pFVar17 = fts5MultiIterAlloc(p,pFVar16->nSegment);
        if (pLeft == (Fts5Buffer *)0x0) {
          uStack_80 = (code *)((ulong)uStack_80._4_4_ << 0x20);
          puVar20 = pToken_00;
          uVar23 = nByte;
        }
        else {
          uStack_80 = (code *)((ulong)uStack_80._4_4_ << 0x20);
          sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)local_88,pLeft->n,pLeft->p);
          puVar20 = (u8 *)"";
          uVar23 = 1;
        }
        sqlite3Fts5BufferAppendBlob(pRc,(Fts5Buffer *)local_88,uVar23,puVar20);
        if (*pRc == 0) {
          if (0 < pFVar16->nLevel) {
            pIter = pFVar17->aSeg;
            __src = local_108->aSeg;
            if (local_108 == (Fts5Iter *)0x0) {
              __src = (Fts5SegIter *)0x0;
            }
            lVar25 = 0;
            do {
              uVar15 = pFVar16->aLevel[lVar25].nSeg;
              iVar12 = uVar15 + 1;
              lVar22 = (ulong)uVar15 * 0x38;
              do {
                iVar12 = iVar12 + -1;
                if (iVar12 < 1) break;
                pSeg = (Fts5StructureSegment *)
                       ((long)&pFVar16->aLevel[lVar25].aSeg[-1].iSegid + lVar22);
                if (__src == (Fts5SegIter *)0x0) {
LAB_001e573b:
                  fts5SegIterSeekInit(p,(u8 *)local_88,(int)uStack_80,0x108,pSeg,pIter);
                }
                else {
                  iVar14 = fts5BufferCompare(pLeft,&__src->term);
                  zData = local_88;
                  if (iVar14 == 0) {
                    if (__src->iEndofDoclist <= __src->pLeaf->szLeaf) goto LAB_001e573b;
                    lVar21 = (long)(int)uStack_80;
                    if (*ppStmt == (sqlite3_stmt *)0x0) {
                      zSql = sqlite3_mprintf("SELECT pgno FROM \'%q\'.\'%q_idx\' WHERE segid=? AND term>? ORDER BY term ASC LIMIT 1"
                                             ,p->pConfig->zDb,p->pConfig->zName);
                      fts5IndexPrepareStmt(p,ppStmt,zSql);
                    }
                    p_00 = (Vdbe *)*ppStmt;
                    if (p_00 == (Vdbe *)0x0) {
                      iVar14 = -1;
                      uVar15 = 0;
                    }
                    else {
                      sqlite3_bind_int64((sqlite3_stmt *)p_00,1,(long)pSeg->iSegid);
                      uVar15 = 0;
                      bindText((sqlite3_stmt *)p_00,2,(void *)zData,lVar21 + -1,
                               (_func_void_void_ptr *)0x0,'\0');
                      iVar13 = sqlite3_step((sqlite3_stmt *)p_00);
                      iVar14 = -1;
                      if (iVar13 == 100) {
                        pMem = columnMem((sqlite3_stmt *)p_00,0);
                        uVar24 = sqlite3VdbeIntValue(pMem);
                        columnMallocFailure((sqlite3_stmt *)p_00);
                        iVar14 = (int)(uVar24 >> 1);
                        uVar15 = (uint)uVar24 & 1;
                      }
                      iVar13 = sqlite3_reset((sqlite3_stmt *)p_00);
                      *pRc = iVar13;
                      iVar13 = vdbeUnbind(p_00,1);
                      if ((iVar13 == 0) &&
                         (psVar5 = p_00->db->mutex, psVar5 != (sqlite3_mutex *)0x0)) {
                        (*sqlite3Config.mutex.xMutexLeave)(psVar5);
                      }
                      if (*pRc != 0) goto LAB_001e575f;
                    }
                    pIter->pSeg = (Fts5StructureSegment *)0x0;
                    pIter->flags = 0;
                    pIter->iLeafPgno = 0;
                    pIter->iRowid = 0;
                    pIter->nPos = 0;
                    pIter->bDel = '\0';
                    *(undefined3 *)&pIter->field_0x7d = 0;
                    (pIter->term).p = (u8 *)0x0;
                    (pIter->term).n = 0;
                    (pIter->term).nSpace = 0;
                    pIter->aRowidOffset = (int *)0x0;
                    pIter->pDlidx = (Fts5DlidxIter *)0x0;
                    pIter->iPgidxOff = 0;
                    pIter->iEndofDoclist = 0;
                    pIter->iRowidOffset = 0;
                    pIter->nRowidOffset = 0;
                    pIter->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                    pIter->iTermLeafPgno = 0;
                    pIter->iTermLeafOffset = 0;
                    pIter->iLeafOffset = 0;
                    pIter->pTombArray = (Fts5TombstoneArray *)0x0;
                    pIter->pLeaf = (Fts5Data *)0x0;
                    pIter->pNextLeaf = (Fts5Data *)0x0;
                    pIter->pSeg = pSeg;
                    *(byte *)&pIter->flags = (byte)pIter->flags | 1;
                    if (-1 < iVar14) {
                      pIter->iLeafPgno = iVar14 + -1;
                      fts5SegIterNextPage(p,pIter);
                      if ((pIter->flags & 2) == 0) {
                        if (p->pConfig->eDetail == 1) {
                          pcVar18 = fts5SegIterNext_None;
                        }
                        else {
                          pcVar18 = fts5SegIterNext;
                        }
                      }
                      else {
                        pcVar18 = fts5SegIterNext_Reverse;
                      }
                      pIter->xNext = pcVar18;
                    }
                    pFVar7 = pIter->pLeaf;
                    if (pFVar7 != (Fts5Data *)0x0) {
                      puVar20 = pFVar7->p;
                      local_98 = (Fts5TokenDataIter *)((ulong)local_98 & 0xffffffff00000000);
                      iVar14 = pFVar7->szLeaf;
                      pIter->iPgidxOff = iVar14;
                      iVar13 = sqlite3Fts5GetVarint32(puVar20 + iVar14,(u32 *)&local_98);
                      pIter->iPgidxOff = iVar13 + iVar14;
                      pIter->iLeafOffset = (long)(int)local_98;
                      fts5SegIterLoadTerm(p,pIter,0);
                      fts5SegIterLoadNPos(p,pIter);
                      if (uVar15 != 0) {
                        fts5SegIterLoadDlidx(p,pIter);
                      }
                    }
                  }
                  else {
                    memcpy(pIter,__src,0x80);
                    __src->pSeg = (Fts5StructureSegment *)0x0;
                    __src->flags = 0;
                    __src->iLeafPgno = 0;
                    __src->pLeaf = (Fts5Data *)0x0;
                    __src->pNextLeaf = (Fts5Data *)0x0;
                    __src->iLeafOffset = 0;
                    __src->pTombArray = (Fts5TombstoneArray *)0x0;
                    __src->xNext = (_func_void_Fts5Index_ptr_Fts5SegIter_ptr_int_ptr *)0x0;
                    __src->iTermLeafPgno = 0;
                    __src->iTermLeafOffset = 0;
                    __src->iPgidxOff = 0;
                    __src->iEndofDoclist = 0;
                    __src->iRowidOffset = 0;
                    __src->nRowidOffset = 0;
                    __src->aRowidOffset = (int *)0x0;
                    __src->pDlidx = (Fts5DlidxIter *)0x0;
                    (__src->term).p = (u8 *)0x0;
                    (__src->term).n = 0;
                    (__src->term).nSpace = 0;
                    __src->iRowid = 0;
                    __src->nPos = 0;
                    __src->bDel = '\0';
                    *(undefined3 *)&__src->field_0x7d = 0;
                  }
                }
LAB_001e575f:
                if (__src == (Fts5SegIter *)0x0) {
                  fts5SegIterAllocTombstone(p,pIter);
                }
                else {
                  pFVar6 = __src->pTombArray;
                  if (pFVar6 != (Fts5TombstoneArray *)0x0) {
                    pIter->pTombArray = pFVar6;
                    pFVar6->nRef = pFVar6->nRef + 1;
                  }
                }
                pIter = pIter + 1;
                if (__src != (Fts5SegIter *)0x0) {
                  __src = __src + 1;
                }
                lVar22 = lVar22 + -0x38;
              } while (*pRc == 0);
              lVar25 = lVar25 + 1;
            } while (lVar25 < pFVar16->nLevel);
          }
          if ((local_108 != (Fts5Iter *)0x0) && (local_108->aSeg[0].pLeaf == (Fts5Data *)0x0)) {
            pFVar8 = local_108->pIndex;
            uVar23 = pLeft->n;
            puVar20 = pLeft->p;
            local_108->aSeg[0].term.n = 0;
            sqlite3Fts5BufferAppendBlob(&pFVar8->rc,&local_108->aSeg[0].term,uVar23,puVar20);
          }
          pFVar17->bSkipEmpty = '\x01';
          pFVar17->pColset = pColset;
          fts5IterSetOutputCb(pRc,pFVar17);
          if (pFVar17->nSeg < 1) {
            pLeft = (Fts5Buffer *)0x0;
          }
          else {
            ppFVar27 = &pFVar17->aSeg[0].pLeaf;
            lVar25 = 0;
            pLeft = (Fts5Buffer *)0x0;
            do {
              pRight = (Fts5Buffer *)(ppFVar27 + 10);
              uVar23 = *(u32 *)(ppFVar27 + 0xb);
              if (nToken < (int)uVar23) {
                puVar20 = pRight->p;
                iVar12 = bcmp(puVar20,pToken_00,__n);
                if ((iVar12 != 0) || ((uVar23 != nByte && (puVar20[__n] != '\0'))))
                goto LAB_001e5962;
              }
              else {
LAB_001e5962:
                sqlite3_free(*ppFVar27);
                *ppFVar27 = (Fts5Data *)0x0;
              }
              if ((*ppFVar27 != (Fts5Data *)0x0) &&
                 ((pLeft == (Fts5Buffer *)0x0 ||
                  (iVar12 = fts5BufferCompare(pLeft,pRight), 0 < iVar12)))) {
                pLeft = pRight;
              }
              lVar25 = lVar25 + 1;
              ppFVar27 = ppFVar27 + 0x10;
            } while (lVar25 < pFVar17->nSeg);
          }
          if (pLeft == (Fts5Buffer *)0x0) {
            fts5IterClose(&pFVar17->base);
            pLeft = (Fts5Buffer *)0x0;
            bVar9 = false;
          }
          else {
            if (*pRc == 0) {
              if (pSet == (Fts5TokenDataIter *)0x0) {
                iVar12 = 0x10;
              }
              else {
                if (pSet->nIter != pSet->nIterAlloc) goto LAB_001e5a83;
                iVar12 = pSet->nIterAlloc * 2;
              }
              uVar15 = iVar12 * 8 + 0x40;
              iVar14 = sqlite3_initialize();
              if (iVar14 == 0) {
                nBytes = 0;
                if (0 < (int)uVar15) {
                  nBytes = (u64)uVar15;
                }
                __s = (Fts5TokenDataIter *)sqlite3Realloc(pSet,nBytes);
              }
              else {
                __s = (Fts5TokenDataIter *)0x0;
              }
              if (__s == (Fts5TokenDataIter *)0x0) {
                *pRc = 7;
              }
              else {
                if (pSet == (Fts5TokenDataIter *)0x0) {
                  memset(__s,0,(long)(int)uVar15);
                }
                __s->nIterAlloc = iVar12;
                pSet = __s;
              }
            }
LAB_001e5a83:
            if (*pRc == 0) {
              iVar12 = pSet->nIter;
              pSet->nIter = iVar12 + 1;
              pSet->apIter[iVar12] = pFVar17;
            }
            else {
              fts5IterClose(&pFVar17->base);
            }
            bVar9 = true;
          }
        }
        else {
          fts5IterClose(&pFVar17->base);
          bVar9 = false;
        }
      } while (bVar9);
      if (((*pRc == 0) && (pSet != (Fts5TokenDataIter *)0x0)) && (0 < pSet->nIter)) {
        lVar25 = 0;
        do {
          pFVar17 = pSet->apIter[lVar25];
          iVar12 = pFVar17->nSeg;
          if (0 < (long)iVar12) {
            lVar22 = 0;
            do {
              pbVar2 = (byte *)((long)&pFVar17->aSeg[0].flags + lVar22);
              *pbVar2 = *pbVar2 | 1;
              lVar22 = lVar22 + 0x80;
            } while ((long)iVar12 * 0x80 != lVar22);
          }
          fts5MultiIterFinishSetup(p,pFVar17);
          lVar25 = lVar25 + 1;
        } while (lVar25 < pSet->nIter);
      }
      if (*pRc == 0) {
        pFVar17 = fts5MultiIterAlloc(p,0);
      }
      else {
        pFVar17 = (Fts5Iter *)0x0;
      }
      if (pFVar17 == (Fts5Iter *)0x0) {
        fts5TokendataIterDelete(pSet);
      }
      else {
        pFVar17->nSeg = 0;
        pFVar17->pTokenDataIter = pSet;
        if (pSet == (Fts5TokenDataIter *)0x0) {
          (pFVar17->base).bEof = '\x01';
        }
        else {
          fts5IterSetOutputsTokendata(pFVar17);
        }
      }
      fts5StructureRelease(pFVar16);
      sqlite3_free((void *)local_88);
      local_a0 = pFVar17;
    }
    else if (pFVar4->nPrefix < (int)uVar24) {
      local_68 = (void *)0x0;
      local_88 = (undefined1  [8])0x0;
      uStack_80._0_4_ = 0;
      uStack_80._4_4_ = 0;
      local_58 = (void *)0x0;
      uStack_50 = 0;
      local_48 = (Fts5TokenDataIter **)0x0;
      local_98 = (Fts5TokenDataIter *)0x0;
      uStack_90 = 0;
      uStack_70 = 1;
      local_78 = 0;
      uStack_60 = 0x20;
      if (((iVar14 == 0) && (p->pConfig->eDetail == 0)) && (p->pConfig->bPrefixInsttoken != 0)) {
        local_48 = &local_98;
        local_98 = (Fts5TokenDataIter *)sqlite3Fts5MallocZero(pRc,0x40);
      }
      if (p->pConfig->eDetail == 1) {
        uStack_80 = fts5AppendRowid;
        local_88 = (undefined1  [8])fts5MergeRowidLists;
      }
      else {
        uStack_70 = CONCAT44(uStack_70._4_4_,0xf);
        uStack_60 = CONCAT44(uStack_60._4_4_,0x78);
        uStack_80 = fts5AppendPoslist;
        local_88 = (undefined1  [8])fts5MergePrefixLists;
      }
      local_68 = sqlite3Fts5MallocZero(pRc,(long)(int)uStack_60 << 4);
      pFVar16 = fts5StructureRead(p);
      if (p->rc == 0) {
        if (iVar14 != 0) {
          *pToken_00 = '0';
          fts5VisitEntries(p,pColset,pToken_00,nByte,0,prefixIterSetupCb,local_88);
        }
        *pToken_00 = (char)iVar14 + '0';
        fts5VisitEntries(p,pColset,pToken_00,nByte,1,prefixIterSetupCb,local_88);
        if (0 < (int)uStack_60) {
          uVar24 = 0;
          do {
            iVar12 = (int)uVar24;
            if (*pRc == 0) {
              (*(code *)local_88)(p,&local_58,uStack_70 & 0xffffffff,
                                  (void *)((long)iVar12 * 0x10 + (long)local_68));
            }
            if ((int)uStack_70 < 1) {
              uVar24 = (ulong)(uint)(iVar12 + (int)uStack_70);
            }
            else {
              lVar21 = (long)iVar12;
              lVar22 = lVar21 << 4;
              lVar25 = lVar21;
              do {
                pvVar10 = local_68;
                sqlite3_free(*(void **)((long)local_68 + lVar22));
                *(undefined8 *)((long)pvVar10 + lVar22) = 0;
                ((undefined8 *)((long)pvVar10 + lVar22))[1] = 0;
                lVar25 = lVar25 + 1;
                uVar24 = (int)uStack_70 + lVar21;
                lVar22 = lVar22 + 0x10;
              } while (lVar25 < (long)uVar24);
            }
          } while ((int)uVar24 < (int)uStack_60);
        }
        p_01 = (undefined8 *)sqlite3Fts5MallocZero(pRc,(long)(int)uStack_50 + 0x18);
        if (p_01 != (undefined8 *)0x0) {
          *p_01 = p_01 + 2;
          *(int *)((long)p_01 + 0xc) = (int)uStack_50;
          *(int *)(p_01 + 1) = (int)uStack_50;
          if ((long)(int)uStack_50 != 0) {
            memcpy(p_01 + 2,local_58,(long)(int)uStack_50);
          }
          pFVar17 = fts5MultiIterAlloc(p,2);
          if (pFVar17 != (Fts5Iter *)0x0) {
            *(undefined4 *)&pFVar17[1].base.pData = 1;
            if (*(int *)((long)p_01 + 0xc) < 1) {
              (pFVar17->base).bEof = '\x01';
            }
            else {
              *(undefined8 **)&pFVar17[1].base.nData = p_01;
              bVar11 = sqlite3Fts5GetVarint((uchar *)*p_01,(u64 *)&pFVar17[1].aSeg[0].flags);
              pFVar17[1].pIndex = (Fts5Index *)(ulong)bVar11;
              *(undefined4 *)((long)&pFVar17[1].xSetOutputs + 4) = *(undefined4 *)(p_01 + 1);
              pFVar17->aFirst[1].iFirst = 1;
              if ((flags & 2U) == 0) {
                fts5SegIterLoadNPos(p,(Fts5SegIter *)(pFVar17 + 1));
              }
              else {
                pFVar17->bRev = 1;
                ppuVar1 = &pFVar17[1].base.pData;
                *(byte *)ppuVar1 = *(byte *)ppuVar1 | 2;
                fts5SegIterReverseInitPage(p,(Fts5SegIter *)(pFVar17 + 1));
              }
              p_01 = (undefined8 *)0x0;
            }
            local_a0 = pFVar17;
            if (((ulong)pFVar17[1].base.pData & 2) == 0) {
              if (p->pConfig->eDetail == 1) {
                pcVar18 = fts5SegIterNext_None;
              }
              else {
                pcVar18 = fts5SegIterNext;
              }
              *(code **)&pFVar17[1].poslist.n = pcVar18;
            }
            else {
              *(code **)&pFVar17[1].poslist.n = fts5SegIterNext_Reverse;
            }
          }
          sqlite3_free(p_01);
        }
        if ((*pRc == 0) && (local_48 != (Fts5TokenDataIter **)0x0)) {
          fts5TokendataIterSortMap(p,local_98);
          local_a0->pTokenDataIter = local_98;
          local_98 = (Fts5TokenDataIter *)0x0;
        }
      }
      fts5TokendataIterDelete(local_98);
      sqlite3_free(local_58);
      local_58 = (void *)0x0;
      uStack_50 = 0;
      fts5StructureRelease(pFVar16);
      sqlite3_free(local_68);
      pFVar17 = local_a0;
      if (((local_a0 != (Fts5Iter *)0x0) && (fts5IterSetOutputCb(pRc,local_a0), *pRc == 0)) &&
         (uVar3 = pFVar17->aFirst[1].iFirst, pFVar17->aSeg[uVar3].pLeaf != (Fts5Data *)0x0)) {
        (*pFVar17->xSetOutputs)(pFVar17,pFVar17->aSeg + uVar3);
      }
    }
    else {
      pFVar16 = fts5StructureRead(p);
      *local_b8.p = (char)uVar24 + '0';
      if (pFVar16 != (Fts5Structure *)0x0) {
        fts5MultiIterNew(p,pFVar16,flags | 0x10,pColset,local_b8.p,nByte,-1,0,&local_a0);
        fts5StructureRelease(pFVar16);
      }
    }
    if (*pRc != 0) {
      fts5IterClose(&local_a0->base);
      local_a0 = (Fts5Iter *)0x0;
      pBlob = p->pReader;
      if (pBlob != (sqlite3_blob *)0x0) {
        p->pReader = (sqlite3_blob *)0x0;
        iVar12 = sqlite3_blob_close(pBlob);
        if (p->rc == 0) {
          *pRc = iVar12;
        }
      }
    }
    *ppIter = &local_a0->base;
    sqlite3_free(local_b8.p);
    local_b8.p = (u8 *)0x0;
    local_b8.n = 0;
    local_b8.nSpace = 0;
  }
  iVar12 = *pRc;
  *pRc = 0;
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return iVar12;
  }
  __stack_chk_fail();
}

Assistant:

static int sqlite3Fts5IndexQuery(
  Fts5Index *p,                   /* FTS index to query */
  const char *pToken, int nToken, /* Token (or prefix) to query for */
  int flags,                      /* Mask of FTS5INDEX_QUERY_X flags */
  Fts5Colset *pColset,            /* Match these columns only */
  Fts5IndexIter **ppIter          /* OUT: New iterator object */
){
  Fts5Config *pConfig = p->pConfig;
  Fts5Iter *pRet = 0;
  Fts5Buffer buf = {0, 0, 0};

  /* If the QUERY_SCAN flag is set, all other flags must be clear. */
  assert( (flags & FTS5INDEX_QUERY_SCAN)==0 || flags==FTS5INDEX_QUERY_SCAN );

  if( sqlite3Fts5BufferSize(&p->rc, &buf, nToken+1)==0 ){
    int iIdx = 0;                 /* Index to search */
    int iPrefixIdx = 0;           /* +1 prefix index */
    int bTokendata = pConfig->bTokendata;
    assert( buf.p!=0 );
    if( nToken>0 ) memcpy(&buf.p[1], pToken, nToken);

    /* The NOTOKENDATA flag is set when each token in a tokendata=1 table
    ** should be treated individually, instead of merging all those with
    ** a common prefix into a single entry. This is used, for example, by
    ** queries performed as part of an integrity-check, or by the fts5vocab
    ** module.  */
    if( flags & (FTS5INDEX_QUERY_NOTOKENDATA|FTS5INDEX_QUERY_SCAN) ){
      bTokendata = 0;
    }

    /* Figure out which index to search and set iIdx accordingly. If this
    ** is a prefix query for which there is no prefix index, set iIdx to
    ** greater than pConfig->nPrefix to indicate that the query will be
    ** satisfied by scanning multiple terms in the main index.
    **
    ** If the QUERY_TEST_NOIDX flag was specified, then this must be a
    ** prefix-query. Instead of using a prefix-index (if one exists),
    ** evaluate the prefix query using the main FTS index. This is used
    ** for internal sanity checking by the integrity-check in debug
    ** mode only.  */
#ifdef SQLITE_DEBUG
    if( pConfig->bPrefixIndex==0 || (flags & FTS5INDEX_QUERY_TEST_NOIDX) ){
      assert( flags & FTS5INDEX_QUERY_PREFIX );
      iIdx = 1+pConfig->nPrefix;
    }else
#endif
    if( flags & FTS5INDEX_QUERY_PREFIX ){
      int nChar = fts5IndexCharlen(pToken, nToken);
      for(iIdx=1; iIdx<=pConfig->nPrefix; iIdx++){
        int nIdxChar = pConfig->aPrefix[iIdx-1];
        if( nIdxChar==nChar ) break;
        if( nIdxChar==nChar+1 ) iPrefixIdx = iIdx;
      }
    }

    if( bTokendata && iIdx==0 ){
      buf.p[0] = FTS5_MAIN_PREFIX;
      pRet = fts5SetupTokendataIter(p, buf.p, nToken+1, pColset);
    }else if( iIdx<=pConfig->nPrefix ){
      /* Straight index lookup */
      Fts5Structure *pStruct = fts5StructureRead(p);
      buf.p[0] = (u8)(FTS5_MAIN_PREFIX + iIdx);
      if( pStruct ){
        fts5MultiIterNew(p, pStruct, flags | FTS5INDEX_QUERY_SKIPEMPTY,
            pColset, buf.p, nToken+1, -1, 0, &pRet
        );
        fts5StructureRelease(pStruct);
      }
    }else{
      /* Scan multiple terms in the main index for a prefix query. */
      int bDesc = (flags & FTS5INDEX_QUERY_DESC)!=0;
      fts5SetupPrefixIter(p, bDesc, iPrefixIdx, buf.p, nToken+1, pColset,&pRet);
      if( pRet==0 ){
        assert( p->rc!=SQLITE_OK );
      }else{
        assert( pRet->pColset==0 );
        fts5IterSetOutputCb(&p->rc, pRet);
        if( p->rc==SQLITE_OK ){
          Fts5SegIter *pSeg = &pRet->aSeg[pRet->aFirst[1].iFirst];
          if( pSeg->pLeaf ) pRet->xSetOutputs(pRet, pSeg);
        }
      }
    }

    if( p->rc ){
      fts5IterClose((Fts5IndexIter*)pRet);
      pRet = 0;
      fts5IndexCloseReader(p);
    }

    *ppIter = (Fts5IndexIter*)pRet;
    sqlite3Fts5BufferFree(&buf);
  }
  return fts5IndexReturn(p);
}